

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_basic_operations.c
# Opt level: O1

void base_rotate_left(cpu_registers *registers,uint8_t *value_to_rotate)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = *value_to_rotate;
  bVar2 = registers->flags;
  registers->flags = bVar1 >> 7 | bVar2 & 0xfe;
  bVar2 = bVar2 & 1 | bVar1 * '\x02';
  *value_to_rotate = bVar2;
  bVar1 = registers->flags;
  bVar2 = (bVar2 == 0) * '\x02';
  registers->flags = bVar2 | bVar1 & 0xfd;
  registers->flags = *value_to_rotate & 0x80 | bVar2 | bVar1 & 0x7d;
  return;
}

Assistant:

void base_rotate_left(cpu_registers* registers, uint8_t* value_to_rotate) {
    uint16_t result = *value_to_rotate << 1;
    if(get_cpu_flag(registers, CARRY_FLAG)) result |= 0x1;
    else result &= ~0x1;
    if(*value_to_rotate & BIT7_BITMASK) set_cpu_flag(registers, CARRY_FLAG);
    else clear_cpu_flag(registers, CARRY_FLAG);
    *value_to_rotate = result & BYTE_MASK;
    determine_zero_flag(registers, *value_to_rotate);
    determine_negative_flag(registers, *value_to_rotate);
}